

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::GetAddedEdges(ObjEncoder *this)

{
  GeometryMetadata *this_00;
  AttributeMetadata *pAVar1;
  PointAttribute *pPVar2;
  byte in_CL;
  string local_60;
  string local_40;
  
  this_00 = (this->in_mesh_->super_PointCloud).metadata_._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if (this_00 == (GeometryMetadata *)0x0) {
    in_CL = 1;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"name","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"added_edges","");
    pAVar1 = GeometryMetadata::GetAttributeMetadataByStringEntry(this_00,&local_40,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if (pAVar1 != (AttributeMetadata *)0x0) {
      pPVar2 = PointCloud::GetAttributeByUniqueId
                         (&this->in_mesh_->super_PointCloud,pAVar1->att_unique_id_);
      if (((pPVar2->num_unique_entries_ == 0) ||
          ((pPVar2->super_GeometryAttribute).num_components_ != '\x01')) ||
         ((pPVar2->super_GeometryAttribute).data_type_ != DT_UINT8)) {
        in_CL = 0;
      }
      else {
        this->added_edges_att_ = pPVar2;
        in_CL = 1;
      }
    }
    in_CL = pAVar1 == (AttributeMetadata *)0x0 | in_CL;
  }
  return (bool)(in_CL & 1);
}

Assistant:

bool ObjEncoder::GetAddedEdges() {
  const GeometryMetadata *mesh_metadata = in_mesh_->GetMetadata();
  if (!mesh_metadata) {
    return true;
  }

  // Try to get a per-corner attribute describing added edges.
  {
    const AttributeMetadata *att_metadata =
        mesh_metadata->GetAttributeMetadataByStringEntry("name", "added_edges");
    if (att_metadata) {
      const auto att =
          in_mesh_->GetAttributeByUniqueId(att_metadata->att_unique_id());
      if (att->size() == 0 || att->num_components() != 1 ||
          att->data_type() != DataType::DT_UINT8) {
        return false;
      }
      added_edges_att_ = att;
      return true;
    }
  }

  return true;
}